

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_policy.cpp
# Opt level: O2

ValuedAction __thiscall
despot::DefaultPolicy::RecursiveValue
          (DefaultPolicy *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  pointer *ppiVar1;
  pointer *ppuVar2;
  pointer ppSVar3;
  State *pSVar4;
  DSPOMDP *pDVar5;
  bool bVar6;
  uint _action;
  int iVar7;
  mapped_type *this_00;
  undefined4 extraout_var;
  _Base_ptr p_Var8;
  int i;
  ulong uVar9;
  _Self __tmp;
  double dVar10;
  double extraout_XMM0_Qa;
  ValuedAction VVar11;
  State *particle;
  double reward;
  OBS_TYPE obs;
  map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
  partitions;
  double local_98;
  State *local_88;
  double local_80;
  key_type local_78;
  ValuedAction local_70;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
  local_60;
  
  bVar6 = RandomStreams::Exhausted(streams);
  if ((bVar6) ||
     ((ulong)(long)DAT_0019fdd4 <=
      (ulong)(((long)(history->actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(history->actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) - (long)this->initial_depth_))) {
    iVar7 = (*(this->particle_lower_bound_->super_ScenarioLowerBound)._vptr_ScenarioLowerBound[6])
                      (this->particle_lower_bound_,particles);
    uVar9 = CONCAT44(extraout_var,iVar7);
    local_70.value = extraout_XMM0_Qa;
  }
  else {
    _action = (*(this->super_ScenarioLowerBound)._vptr_ScenarioLowerBound[6])
                        (this,particles,streams,history);
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98 = 0.0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    for (uVar9 = 0;
        ppSVar3 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar9 < (ulong)((long)(particles->
                              super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar3 >> 3);
        uVar9 = uVar9 + 1) {
      pSVar4 = ppSVar3[uVar9];
      pDVar5 = (this->super_ScenarioLowerBound).model_;
      local_88 = pSVar4;
      RandomStreams::Entry(streams,pSVar4->scenario_id);
      iVar7 = (*pDVar5->_vptr_DSPOMDP[2])(pDVar5,pSVar4,(ulong)_action,&local_80,&local_78);
      dVar10 = local_80 * local_88->weight;
      if ((char)iVar7 == '\0') {
        this_00 = std::
                  map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
                  ::operator[]((map<unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
                                *)&local_60,&local_78);
        std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back(this_00,&local_88)
        ;
      }
      local_98 = local_98 + dVar10;
    }
    for (p_Var8 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &local_60._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      History::Add(history,_action,*(OBS_TYPE *)(p_Var8 + 1));
      RandomStreams::Advance(streams);
      VVar11 = RecursiveValue(this,(vector<despot::State_*,_std::allocator<despot::State_*>_> *)
                                   &p_Var8[1]._M_parent,streams,history);
      dVar10 = DAT_0019fdd8;
      RandomStreams::Back(streams);
      ppiVar1 = &(history->actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppiVar1 = *ppiVar1 + -1;
      local_98 = local_98 + dVar10 * VVar11.value;
      ppuVar2 = &(history->observations_).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar2 = *ppuVar2 + -1;
    }
    ValuedAction::ValuedAction(&local_70,_action,local_98);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>_>_>
    ::~_Rb_tree(&local_60);
    uVar9 = (ulong)(uint)local_70.action;
  }
  VVar11.value = local_70.value;
  VVar11._0_8_ = uVar9;
  return VVar11;
}

Assistant:

ValuedAction DefaultPolicy::RecursiveValue(const vector<State*>& particles,
	RandomStreams& streams, History& history) const {
	if (streams.Exhausted()
		|| (history.Size() - initial_depth_
			>= Globals::config.max_policy_sim_len)) {
		return particle_lower_bound_->Value(particles);
	} else {
		ACT_TYPE action = Action(particles, streams, history);

		double value = 0;

		map<OBS_TYPE, vector<State*> > partitions;
		OBS_TYPE obs;
		double reward;
		for (int i = 0; i < particles.size(); i++) {
			State* particle = particles[i];
			bool terminal = model_->Step(*particle,
				streams.Entry(particle->scenario_id), action, reward, obs);

			value += reward * particle->weight;

			if (!terminal) {
				partitions[obs].push_back(particle);
			}
		}

		for (map<OBS_TYPE, vector<State*> >::iterator it = partitions.begin();
			it != partitions.end(); it++) {
			OBS_TYPE obs = it->first;
			history.Add(action, obs);
			streams.Advance();
			ValuedAction va = RecursiveValue(it->second, streams, history);
			value += Globals::Discount() * va.value;
			streams.Back();
			history.RemoveLast();
		}

		return ValuedAction(action, value);
	}
}